

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

wchar_t read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  byte bVar2;
  mtree *mtree;
  __mode_t p;
  wchar_t wVar3;
  wchar_t wVar4;
  mode_t mVar5;
  int iVar6;
  mtree_entry *pmVar7;
  int *piVar8;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar9;
  archive_string *paVar10;
  ushort **ppuVar11;
  size_t sVar12;
  mtree_entry **ppmVar13;
  archive_rb_node *paVar14;
  archive_rb_node *paVar15;
  size_t len;
  mtree_entry *pmVar16;
  la_int64_t lVar17;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  size_t sVar24;
  __dev_t _Var25;
  mtree_entry *pmVar26;
  mtree_entry *pmVar27;
  mtree_option *pmVar28;
  archive_rb_tree *rbt;
  char *pcVar29;
  long lVar30;
  uint uVar31;
  mtree_entry *local_130;
  wchar_t local_11c;
  mtree_option *global;
  mtree_entry *local_110;
  mtree_entry *local_108;
  mtree_entry *local_100;
  archive_rb_tree *local_f8;
  ulong local_f0;
  mtree_entry *local_e8;
  mtree_entry *local_e0;
  archive_rb_tree *local_d8;
  archive_entry *sparse_entry;
  mtree_entry **local_c8;
  stat_conflict1 st_storage;
  
  mtree = (mtree *)a->format->data;
  if (L'\xffffffff' < mtree->fd) {
    close(mtree->fd);
    mtree->fd = L'\xffffffff';
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return L'\xffffffe2';
    }
    local_c8 = &mtree->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = L'\x00080000';
    mtree->archive_format_name = "mtree";
    global = (mtree_option *)0x0;
    detect_form(a,(wchar_t *)&sparse_entry);
    local_d8 = &mtree->rbtree;
    local_110 = (mtree_entry *)0x0;
    local_f8 = (archive_rb_tree *)0x1;
LAB_001434ab:
    lVar30 = 0;
    local_130 = (mtree_entry *)0x0;
    while (__s = __archive_read_ahead(a,1,(ssize_t *)&st_storage), _Var25 = st_storage.st_dev,
          __s != (void *)0x0) {
      if ((long)st_storage.st_dev < 0) goto LAB_00143c71;
      pvVar9 = memchr(__s,10,st_storage.st_dev);
      if (pvVar9 != (void *)0x0) {
        _Var25 = (long)pvVar9 + (1 - (long)__s);
        st_storage.st_dev = _Var25;
      }
      if (0xffff < (long)(_Var25 + (long)local_130)) {
        pcVar18 = "Line too long";
        iVar6 = 0x54;
        goto LAB_00143c4d;
      }
      paVar10 = archive_string_ensure((archive_string *)mtree,_Var25 + (long)local_130 + 1);
      if (paVar10 == (archive_string *)0x0) {
        pcVar18 = "Can\'t allocate working buffer";
        iVar6 = 0xc;
        goto LAB_00143c4d;
      }
      memcpy((mtree->line).s + (long)local_130,__s,st_storage.st_dev);
      __archive_read_consume(a,st_storage.st_dev);
      lVar19 = st_storage.st_dev + (long)local_130;
      (mtree->line).s[lVar19] = '\0';
      pmVar7 = (mtree_entry *)(mtree->line).s;
      pcVar18 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar30);
LAB_0014356d:
      cVar1 = *pcVar18;
      if (cVar1 == '#') {
        if (pvVar9 == (void *)0x0) goto LAB_001435af;
LAB_0014359e:
        pcVar18 = pcVar18 + 1;
        goto LAB_0014356d;
      }
      if (cVar1 != '\\') {
        if (cVar1 == '\0') goto LAB_001435af;
        if (cVar1 == '\n') {
          if (lVar19 == 0) break;
          if (lVar19 < 0) {
            wVar3 = (wchar_t)lVar19;
            goto LAB_00143c75;
          }
          lVar30 = 0;
          pmVar26 = pmVar7;
          goto LAB_001435dc;
        }
        goto LAB_0014359e;
      }
      if (pcVar18[1] == '\0') goto LAB_0014359e;
      if (pcVar18[1] != '\n') {
        pcVar18 = pcVar18 + 1;
        goto LAB_0014359e;
      }
      *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar19 + -2) = '\0';
      lVar19 = lVar19 + -2;
      pmVar7 = (mtree_entry *)(mtree->line).s;
LAB_001435af:
      lVar30 = (long)pcVar18 - (long)pmVar7;
      local_130 = (mtree_entry *)lVar19;
    }
    mtree->this_entry = mtree->entries;
    wVar3 = L'\0';
    goto LAB_00143c75;
  }
LAB_00143099:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  paVar10 = &mtree->current_dir;
  rbt = &mtree->rbtree;
  pmVar7 = mtree->this_entry;
  local_f8 = rbt;
  do {
    if (pmVar7 == (mtree_entry *)0x0) {
      return L'\x01';
    }
    pcVar18 = pmVar7->name;
    if (((*pcVar18 == '.') && (pcVar18[1] == '.')) && (pcVar18[2] == '\0')) {
      pmVar7->used = '\x01';
      sVar24 = (mtree->current_dir).length;
      if (sVar24 != 0) {
        pcVar18 = paVar10->s;
        pcVar23 = pcVar18 + sVar24;
        do {
          pcVar29 = pcVar23;
          pcVar23 = pcVar29 + -1;
          if (pcVar23 < pcVar18) break;
        } while (*pcVar23 != '/');
        pcVar29 = pcVar29 + -2;
        if (pcVar23 < pcVar18) {
          pcVar29 = pcVar23;
        }
        (mtree->current_dir).length = (size_t)(pcVar29 + (1 - (long)pcVar18));
      }
    }
    else if (pmVar7->used == '\0') {
      pmVar7->used = '\x01';
      global = (mtree_option *)entry;
      archive_entry_set_filetype(entry,0x8000);
      archive_entry_set_size(entry,0);
      (mtree->contents_name).length = 0;
      local_11c = L'\0';
      wVar3 = parse_line(a,entry,mtree,pmVar7,&local_11c);
      if (pmVar7->full == '\0') {
        sVar24 = (mtree->current_dir).length;
        if (sVar24 != 0) {
          archive_strcat(paVar10,"/");
        }
        archive_strcat(paVar10,pmVar7->name);
        archive_entry_copy_pathname(entry,paVar10->s);
        mVar5 = archive_entry_filetype(entry);
        rbt = local_f8;
        if (mVar5 != 0x4000) {
          (mtree->current_dir).length = sVar24;
        }
      }
      else {
        archive_entry_copy_pathname(entry,pmVar7->name);
        for (pmVar7 = (mtree_entry *)__archive_rb_tree_find_node(rbt,pmVar7->name);
            pmVar7 != (mtree_entry *)0x0; pmVar7 = pmVar7->next_dup) {
          if ((pmVar7->full != '\0') && (pmVar7->used == '\0')) {
            pmVar7->used = '\x01';
            wVar4 = parse_line(a,entry,mtree,pmVar7,&local_11c);
            if (wVar4 < wVar3) {
              wVar3 = wVar4;
            }
          }
        }
      }
      if (mtree->checkfs == '\0') goto LAB_00143be3;
      mtree->fd = L'\xffffffff';
      if ((mtree->contents_name).length == 0) {
        pcVar18 = archive_entry_pathname(entry);
      }
      else {
        pcVar18 = (mtree->contents_name).s;
      }
      mVar5 = archive_entry_filetype(entry);
      if ((mVar5 == 0x8000) || (mVar5 = archive_entry_filetype(entry), mVar5 == 0x4000)) {
        wVar4 = open(pcVar18,0x80000);
        mtree->fd = wVar4;
        __archive_ensure_cloexec_flag(wVar4);
        wVar4 = mtree->fd;
        if (wVar4 == L'\xffffffff') {
          piVar8 = __errno_location();
          if ((*piVar8 != 2) || ((mtree->contents_name).length != 0)) {
            archive_set_error(&a->archive,*piVar8,"Can\'t open %s",pcVar18);
            wVar3 = L'\xffffffec';
          }
          goto LAB_0014327d;
        }
      }
      else {
LAB_0014327d:
        wVar4 = mtree->fd;
      }
      if (wVar4 < L'\0') {
        iVar6 = lstat(pcVar18,(stat *)&st_storage);
        if (iVar6 == -1) goto LAB_0014330d;
LAB_001432d1:
        p = st_storage.st_mode;
        uVar31 = st_storage.st_mode & 0xf000;
        if (uVar31 == 0xa000) {
          mVar5 = archive_entry_filetype(entry);
          if (mVar5 != 0xa000) goto LAB_0014337c;
        }
        else if ((uVar31 != 0x8000) || (mVar5 = archive_entry_filetype(entry), mVar5 != 0x8000)) {
LAB_0014337c:
          if (((~p & 0xc000) != 0) || (mVar5 = archive_entry_filetype(entry), mVar5 != 0xc000)) {
            switch(uVar31 - 0x1000 >> 0xc) {
            case 0:
              mVar5 = archive_entry_filetype(entry);
              if (mVar5 == 0x1000) goto LAB_00143aab;
              break;
            case 1:
              mVar5 = archive_entry_filetype(entry);
              if (mVar5 == 0x2000) goto LAB_00143aab;
              break;
            case 3:
              mVar5 = archive_entry_filetype(entry);
              if (mVar5 == 0x4000) goto LAB_00143aab;
              break;
            case 5:
              mVar5 = archive_entry_filetype(entry);
              if (mVar5 == 0x6000) goto LAB_00143aab;
            }
            if (L'\xffffffff' < mtree->fd) {
              close(mtree->fd);
            }
            mtree->fd = L'\xffffffff';
            if ((local_11c & 0x800U) == 0) {
              if (wVar3 != L'\0') {
                return wVar3;
              }
              pcVar18 = archive_entry_pathname(entry);
              archive_set_error(&a->archive,-1,"mtree specification has different type for %s",
                                pcVar18);
              return L'\xffffffec';
            }
            goto LAB_0014342a;
          }
        }
LAB_00143aab:
        wVar4 = local_11c;
        if (((local_11c & 0x1001U) != 1) &&
           ((mVar5 = archive_entry_filetype(entry), mVar5 == 0x2000 ||
            (mVar5 = archive_entry_filetype(entry), mVar5 == 0x6000)))) {
          archive_entry_set_rdev(entry,st_storage.st_rdev);
        }
        if ((wVar4 & 0xcU) == 0 || ((uint)wVar4 >> 0xc & 1) != 0) {
          archive_entry_set_gid(entry,(ulong)st_storage.st_gid);
        }
        if ((wVar4 & 0x600U) == 0 || ((uint)wVar4 >> 0xc & 1) != 0) {
          archive_entry_set_uid(entry,(ulong)st_storage.st_uid);
        }
        if ((wVar4 & 0x1010U) != 0x10) {
          archive_entry_set_mtime(entry,st_storage.st_mtim.tv_sec,st_storage.st_mtim.tv_nsec);
        }
        if ((wVar4 & 0x1020U) != 0x20) {
          archive_entry_set_nlink(entry,(uint)st_storage.st_nlink);
        }
        if ((wVar4 & 0x1040U) != 0x40) {
          archive_entry_set_perm(entry,p);
        }
        if ((wVar4 & 0x1080U) != 0x80) {
          archive_entry_set_size(entry,st_storage.st_size);
        }
        archive_entry_set_ino(entry,st_storage.st_ino);
        archive_entry_set_dev(entry,st_storage.st_dev);
        archive_entry_linkify(mtree->resolver,(archive_entry **)&global,&sparse_entry);
        entry = (archive_entry *)global;
LAB_00143be3:
        lVar17 = archive_entry_size(entry);
        mtree->cur_size = lVar17;
        mtree->offset = 0;
        return wVar3;
      }
      iVar6 = fstat(wVar4,(stat *)&st_storage);
      if (iVar6 != -1) goto LAB_001432d1;
      piVar8 = __errno_location();
      archive_set_error(&a->archive,*piVar8,"Could not fstat %s",pcVar18);
      close(mtree->fd);
      mtree->fd = L'\xffffffff';
      wVar3 = L'\xffffffec';
LAB_0014330d:
      if ((local_11c & 0x800U) == 0) goto LAB_00143be3;
LAB_0014342a:
      pmVar7 = mtree->this_entry;
    }
    pmVar7 = pmVar7->next;
    mtree->this_entry = pmVar7;
  } while( true );
LAB_001435dc:
  pmVar26 = (mtree_entry *)((long)(pmVar26->rbnode).rb_nodes + 1);
  bVar2 = *(byte *)((long)(pmVar7->rbnode).rb_nodes + lVar30);
  uVar21 = (ulong)bVar2;
  if (0x23 < uVar21) goto LAB_0014360f;
  if ((0x100000200U >> (uVar21 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar21 & 0x3f) & 1) != 0) goto LAB_00143605;
    goto LAB_0014360f;
  }
  lVar30 = lVar30 + 1;
  goto LAB_001435dc;
LAB_0014360f:
  pmVar27 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + lVar30);
  local_f0 = (st_storage.st_dev + (long)local_130) - lVar30;
  local_130 = (mtree_entry *)((long)pmVar27 + (local_f0 - 1));
  local_108 = pmVar7;
  local_100 = pmVar27;
  while (iVar6 = (int)sparse_entry, pmVar27 < local_130) {
    ppuVar11 = __ctype_b_loc();
    paVar14 = &pmVar27->rbnode;
    pmVar27 = (mtree_entry *)((long)(pmVar27->rbnode).rb_nodes + 1);
    if ((*(byte *)((long)*ppuVar11 + (ulong)*(byte *)paVar14->rb_nodes * 2 + 1) & 0x40) == 0)
    goto LAB_00143c56;
  }
  if (bVar2 != 0x2f) {
    local_e8 = (mtree_entry *)malloc(0x40);
    pmVar27 = local_100;
    pmVar7 = local_108;
    if (local_e8 != (mtree_entry *)0x0) {
      *(undefined8 *)((long)&local_e8->options + 2) = 0;
      *(undefined8 *)((long)&local_e8->name + 2) = 0;
      local_e8->next = (mtree_entry *)0x0;
      local_e8->options = (mtree_option *)0x0;
      ppmVar13 = &local_110->next;
      if (local_110 == (mtree_entry *)0x0) {
        ppmVar13 = local_c8;
      }
      *ppmVar13 = local_e8;
      local_e0 = local_e8;
      if (iVar6 == 0) {
        pcVar18 = (char *)strcspn((char *)local_100," \t\r\n");
        pmVar7 = (mtree_entry *)(pcVar18 + (long)((long)(pmVar7->rbnode).rb_nodes + lVar30));
        local_110 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + local_f0);
      }
      else {
        uVar21 = local_f0;
        while (((uVar22 = (long)local_f0 >> 0x3f & local_f0, 0 < (long)uVar21 &&
                (uVar20 = (ulong)*(byte *)(local_130->rbnode).rb_nodes, uVar22 = uVar21,
                uVar20 < 0x21)) && ((0x100002600U >> (uVar20 & 0x3f) & 1) != 0))) {
          uVar21 = uVar21 - 1;
          local_130 = (mtree_entry *)&local_130[-1].field_0x3f;
        }
        uVar21 = 0;
        if (0 < (long)uVar22) {
          uVar21 = uVar22;
        }
        while (uVar21 != 0) {
          if (((ulong)(byte)pmVar26[-1].field_0x3f < 0x21) &&
             ((0x100002600U >> ((ulong)(byte)pmVar26[-1].field_0x3f & 0x3f) & 1) != 0)) {
            pmVar27 = pmVar26;
          }
          pmVar26 = (mtree_entry *)((long)(pmVar26->rbnode).rb_nodes + 1);
          uVar21 = uVar21 - 1;
        }
        pcVar18 = (char *)((long)local_108 + lVar30 + (uVar22 - (long)pmVar27));
        pmVar7 = local_100;
        local_110 = pmVar27;
      }
      pcVar23 = (char *)malloc((size_t)(pcVar18 + 1));
      pmVar26 = local_e0;
      local_e0->name = pcVar23;
      if (pcVar23 != (char *)0x0) {
        memcpy(pcVar23,pmVar27,(size_t)pcVar18);
        pcVar23[(long)pcVar18] = '\0';
        parse_escapes(pcVar23,pmVar26);
        pmVar27 = local_e8;
        pmVar26->next_dup = (mtree_entry *)0x0;
        if ((pmVar26->full != '\0') &&
           (iVar6 = __archive_rb_tree_insert_node(local_d8,&pmVar26->rbnode), iVar6 == 0)) {
          paVar14 = __archive_rb_tree_find_node(local_d8,pmVar26->name);
          do {
            paVar15 = paVar14;
            paVar14 = paVar15[1].rb_nodes[0];
          } while (paVar14 != (archive_rb_node *)0x0);
          paVar15[1].rb_nodes[0] = &pmVar26->rbnode;
        }
        pmVar28 = (mtree_option *)&global;
        while (pmVar28 = pmVar28->next, pmVar26 = (mtree_entry *)&pmVar27->options,
              pmVar28 != (mtree_option *)0x0) {
          pcVar18 = pmVar28->value;
          sVar12 = strlen(pcVar18);
          wVar3 = add_option(a,&pmVar27->options,pcVar18,sVar12);
          if (wVar3 != L'\0') goto LAB_00143c75;
        }
        while ((local_e8 = pmVar26, sVar12 = strspn((char *)pmVar7," \t\r\n"),
               *(char *)((long)(pmVar7->rbnode).rb_nodes + sVar12) != '\0' &&
               (pmVar26 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + sVar12),
               pmVar26 < local_110))) {
          len = strcspn((char *)pmVar26," \t\r\n");
          pmVar7 = (mtree_entry *)((long)(pmVar26->rbnode).rb_nodes + len);
          pmVar16 = (mtree_entry *)strchr((char *)pmVar26,0x3d);
          pmVar27 = local_e8;
          sVar12 = (long)pmVar16 - (long)pmVar26;
          if (pmVar7 < pmVar16) {
            sVar12 = len;
          }
          if (pmVar16 == (mtree_entry *)0x0) {
            sVar12 = len;
          }
          remove_option((mtree_option **)local_e8,(char *)pmVar26,sVar12);
          wVar3 = add_option(a,(mtree_option **)pmVar27,(char *)pmVar26,len);
          pmVar26 = local_e8;
          if (wVar3 != L'\0') goto LAB_00143c75;
        }
        local_110 = local_e0;
        goto LAB_00143605;
      }
    }
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    pcVar18 = "Can\'t allocate memory";
    goto LAB_00143c4d;
  }
  if (4 < (long)local_f0) {
    iVar6 = strncmp((char *)local_100,"/set",4);
    if (iVar6 == 0) {
      cVar1 = *(char *)((long)(local_108->rbnode).rb_nodes + lVar30 + 4);
      if ((cVar1 == ' ') || (cVar1 == '\t')) {
        pcVar18 = (char *)((long)(local_108->rbnode).rb_nodes + lVar30 + 4);
        while (sVar12 = strspn(pcVar18," \t\r\n"), pcVar18[sVar12] != '\0') {
          pcVar29 = pcVar18 + sVar12;
          sVar12 = strcspn(pcVar29," \t\r\n");
          pcVar18 = pcVar29 + sVar12;
          pcVar23 = strchr(pcVar29,0x3d);
          sVar24 = (long)pcVar23 - (long)pcVar29;
          if (pcVar18 < pcVar23) {
            sVar24 = sVar12;
          }
          remove_option(&global,pcVar29,sVar24);
          wVar3 = add_option(a,&global,pcVar29,sVar12);
          if (wVar3 != L'\0') goto LAB_00143c75;
        }
        goto LAB_00143605;
      }
    }
    else if (((6 < local_f0) && (iVar6 = strncmp((char *)local_100,"/unset",6), iVar6 == 0)) &&
            ((cVar1 = *(char *)((long)(local_108->rbnode).rb_nodes + lVar30 + 6), cVar1 == ' ' ||
             (cVar1 == '\t')))) {
      pcVar23 = (char *)((long)(local_108->rbnode).rb_nodes + lVar30 + 6);
      pcVar18 = strchr(pcVar23,0x3d);
      if (pcVar18 != (char *)0x0) goto LAB_00143cbc;
      while( true ) {
        sVar12 = strspn(pcVar23," \t\r\n");
        cVar1 = pcVar23[sVar12];
        if (cVar1 == '\0') break;
        pcVar23 = pcVar23 + sVar12;
        sVar12 = strcspn(pcVar23," \t\r\n");
        if (((cVar1 == 'a' && sVar12 == 3) && (pcVar23[1] == 'l')) && (pcVar23[2] == 'l')) {
          free_options(global);
          global = (mtree_option *)0x0;
        }
        else {
          remove_option(&global,pcVar23,sVar12);
        }
        pcVar23 = pcVar23 + sVar12;
      }
LAB_00143605:
      local_f8 = (archive_rb_tree *)((long)local_f8 + 1);
      goto LAB_001434ab;
    }
  }
LAB_00143c56:
  archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_f8);
  goto LAB_00143c71;
LAB_00143cbc:
  pcVar18 = "/unset shall not contain `=\'";
  iVar6 = -1;
LAB_00143c4d:
  archive_set_error(&a->archive,iVar6,pcVar18);
LAB_00143c71:
  wVar3 = L'\xffffffe2';
LAB_00143c75:
  free_options(global);
  if (wVar3 != L'\0') {
    return wVar3;
  }
  goto LAB_00143099;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      /*
       * Do not increment filename_size here as the computations below
       * add the space for the terminating NUL explicitly.
       */
      filename[filename_size] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }
  else if (rar->filename_must_match)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Mismatch of file parts split across multi-volume archive");
    return (ARCHIVE_FATAL);
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
  rar->ppmd_valid = rar->ppmd_eod = 0;
  rar->filters.filterstart = INT64_MAX;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}